

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

size_t dg::vr::limitingBorder(ValueRelations *relations,Value *val)

{
  bool bVar1;
  size_t sVar2;
  ValueRelations *in_RDI;
  size_t mId;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> *handleRel;
  iterator __end2;
  iterator __begin2;
  RelationsMap *__range2;
  Handle in_stack_ffffffffffffff68;
  ValueRelations *this;
  Relations *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  _Self in_stack_ffffffffffffff98;
  _Self local_60;
  undefined1 local_58 [8];
  undefined1 local_50 [48];
  undefined1 *local_20;
  ValueRelations *local_10;
  size_t local_8;
  
  local_10 = in_RDI;
  memset(local_58,0,8);
  Relations::Relations((Relations *)0x1cf1ef);
  Relations::sle((Relations *)0x1cf1f9);
  ValueRelations::getRelated<llvm::Value_const*>
            ((ValueRelations *)in_stack_ffffffffffffff98._M_node,
             (Value **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  local_20 = local_50;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                *)in_stack_ffffffffffffff68);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::end((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         *)in_stack_ffffffffffffff68);
  do {
    bVar1 = std::operator!=(&local_60,(_Self *)&stack0xffffffffffffff98);
    if (!bVar1) {
      iVar3 = 2;
LAB_001cf2c0:
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
              *)0x1cf2ca);
      if (iVar3 != 1) {
        local_8 = 0xffffffffffffffff;
      }
      return local_8;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                 *)0x1cf262);
    this = local_10;
    std::reference_wrapper::operator_cast_to_Bucket_
              ((reference_wrapper<const_dg::vr::Bucket> *)0x1cf27e);
    sVar2 = ValueRelations::getBorderId(this,in_stack_ffffffffffffff68);
    if (sVar2 != 0xffffffffffffffff) {
      iVar3 = 1;
      local_8 = sVar2;
      goto LAB_001cf2c0;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)this);
  } while( true );
}

Assistant:

size_t limitingBorder(const ValueRelations &relations, const llvm::Value *val) {
    for (const auto &handleRel : relations.getRelated(val, Relations().sle())) {
        auto mId = relations.getBorderId(handleRel.first);
        if (mId != std::string::npos)
            return mId;
    }
    return std::string::npos;
}